

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O0

void __thiscall CLASSWEIGHTS::classweights::load_string(classweights *this,string *source)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  vw_exception *this_00;
  long lVar3;
  string *pmessage;
  undefined8 uVar4;
  string *in_RSI;
  float weight_double;
  int klass_int;
  stringstream __msg;
  string weight;
  string klass;
  stringstream inner_ss;
  string item;
  stringstream ss;
  undefined4 in_stack_fffffffffffffa68;
  float in_stack_fffffffffffffa6c;
  string *in_stack_fffffffffffffa70;
  string *this_01;
  int plineNumber;
  undefined4 in_stack_fffffffffffffa9c;
  stringstream local_518 [16];
  ostream local_508;
  string local_390 [32];
  string local_370 [32];
  stringstream local_350 [408];
  string local_1b8 [32];
  stringstream local_198 [408];
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,in_RSI,_Var2);
  std::__cxx11::string::string(local_1b8);
  while( true ) {
    this_00 = (vw_exception *)
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_198,local_1b8,',');
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&this_00->super_exception + *(long *)(*(long *)this_00 + -0x18)));
    in_stack_fffffffffffffa9c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa9c);
    if (!bVar1) {
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::stringstream::~stringstream(local_198);
      return;
    }
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_350,local_1b8,_Var2);
    this_01 = local_370;
    std::__cxx11::string::string(this_01);
    std::__cxx11::string::string(local_390);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_350,this_01,':')
    ;
    plineNumber = (int)((ulong)this_01 >> 0x20);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_350,local_390,':');
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0) break;
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0) break;
    std::__cxx11::stoi(in_stack_fffffffffffffa70,
                       (size_t *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),0);
    in_stack_fffffffffffffa6c =
         std::__cxx11::stof(in_stack_fffffffffffffa70,
                            (size_t *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68))
    ;
    in_stack_fffffffffffffa70 =
         (string *)
         std::
         unordered_map<unsigned_int,_float,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
         ::operator[]((unordered_map<unsigned_int,_float,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                       *)in_stack_fffffffffffffa70,
                      (key_type *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    *(float *)in_stack_fffffffffffffa70 = in_stack_fffffffffffffa6c;
    std::__cxx11::string::~string(local_390);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::stringstream::~stringstream(local_350);
  }
  std::__cxx11::stringstream::stringstream(local_518);
  pmessage = (string *)std::operator<<(&local_508,"error: while parsing --classweight ");
  std::operator<<((ostream *)pmessage,local_1b8);
  uVar4 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (this_00,(char *)CONCAT44(in_stack_fffffffffffffa9c,_Var2),plineNumber,pmessage);
  __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void load_string(std::string const& source)
  {
    std::stringstream ss(source);
    std::string item;
    while (std::getline(ss, item, ','))
    {
      std::stringstream inner_ss(item);
      std::string klass;
      std::string weight;
      std::getline(inner_ss, klass, ':');
      std::getline(inner_ss, weight, ':');

      if (!klass.size() || !weight.size())
      {
        THROW("error: while parsing --classweight " << item);
      }

      int klass_int = std::stoi(klass);
      float weight_double = std::stof(weight);

      weights[klass_int] = weight_double;
    }
  }